

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::updateConfig
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Parameters *parameters)

{
  Client *client;
  allocator<char> local_99;
  uint *local_98;
  undefined8 local_90;
  uint local_88 [2];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint *local_78;
  undefined8 local_70;
  uint local_68 [2];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string local_58;
  Url local_38;
  
  if (this->version_ == v2) {
    client = this->client_;
    Vault::operator+(&local_58,"/v1/",&this->mount_);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"/config",&local_99);
    local_70 = local_90;
    local_78 = local_68;
    if (local_98 == local_88) {
      uStack_60 = uStack_80;
      uStack_5c = uStack_7c;
    }
    else {
      local_78 = local_98;
    }
    local_90 = 0;
    local_88[0] = local_88[0] & 0xffffff00;
    local_98 = local_88;
    (*client->_vptr_Client[3])(&local_38,client,&local_58);
    HttpConsumer::post(__return_storage_ptr__,client,&local_38,parameters);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::updateConfig(const Parameters &parameters) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::post(
      client_, client_.getUrl("/v1/" + mount_, Vault::Path{"/config"}),
      parameters);
}